

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O3

void __thiscall CodegenC::FunctionTable::generate_tuple_functions(FunctionTable *this,Type *type)

{
  IndentPrinter *this_00;
  Type *pTVar1;
  VoidType *pVVar2;
  TypePointer<VoidType> type_00;
  int iVar3;
  VoidType *__tmp_1;
  size_t sVar4;
  _func_int **pp_Var5;
  uint uVar6;
  undefined4 uVar7;
  ulong uVar8;
  VoidType *__tmp;
  Type tuple_type;
  Type void_type;
  undefined1 local_7c [4];
  Type local_78;
  undefined1 local_6c [4];
  undefined1 local_68 [32];
  char *local_48;
  Type local_40;
  Type local_38;
  
  sVar4 = define_type(this,type);
  generate_functions(this,type);
  local_40.index = sVar4;
  if (TypeInterner::void_type.pointer == (VoidType *)0x0) {
    TypeInterner::void_type.pointer = (VoidType *)operator_new(8);
    ((TypeInterner::void_type.pointer)->super_Type)._vptr_Type = (_func_int **)&PTR__Type_00152550;
  }
  type_00.pointer = TypeInterner::void_type.pointer;
  sVar4 = define_type(this,&(TypeInterner::void_type.pointer)->super_Type);
  generate_functions(this,&(type_00.pointer)->super_Type);
  this_00 = this->type_function_printer;
  local_48 = "static % %_copy(%);";
  local_68._0_8_ = &local_40;
  local_68._8_8_ = &local_40;
  local_68._16_8_ = &local_40;
  local_38.index = sVar4;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this->function_declaration_printer,
             (Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  local_48 = "static % %_copy(% tuple) {";
  local_68._0_8_ = &local_40;
  local_68._8_8_ = &local_40;
  local_68._16_8_ = &local_40;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this_00,(Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  this_00->indentation = this_00->indentation + 1;
  local_68._16_8_ = "% new_tuple;";
  local_68._0_8_ = &local_40;
  IndentPrinter::println<Format<CodegenC::Type>>(this_00,(Format<CodegenC::Type> *)local_68);
  pp_Var5 = type[1]._vptr_Type;
  if (type[2]._vptr_Type != pp_Var5) {
    uVar8 = 0;
    do {
      iVar3 = (**(code **)(*(long *)pp_Var5[uVar8] + 0x10))();
      uVar7 = (undefined4)uVar8;
      if ((iVar3 - 3U < 6) || (iVar3 == 10)) {
        pTVar1 = (Type *)type[1]._vptr_Type[uVar8];
        local_7c = (undefined1  [4])uVar7;
        sVar4 = define_type(this,pTVar1);
        generate_functions(this,pTVar1);
        local_68._0_8_ = local_7c;
        local_68._8_8_ = &local_78;
        local_68._16_8_ = local_6c;
        local_48 = "new_tuple.v% = %_copy(tuple.v%);";
        local_78.index = sVar4;
        local_6c = (undefined1  [4])uVar7;
        IndentPrinter::println<Format<PrintNumber,CodegenC::Type,PrintNumber>>
                  (this_00,(Format<PrintNumber,_CodegenC::Type,_PrintNumber> *)local_68);
      }
      else {
        pVVar2 = (VoidType *)type[1]._vptr_Type[uVar8];
        if (TypeInterner::void_type.pointer == (VoidType *)0x0) {
          TypeInterner::void_type.pointer = (VoidType *)operator_new(8);
          ((TypeInterner::void_type.pointer)->super_Type)._vptr_Type =
               (_func_int **)&PTR__Type_00152550;
        }
        if (pVVar2 != TypeInterner::void_type.pointer) {
          local_78.index._0_4_ = uVar7;
          local_68._0_8_ = &local_78;
          local_68._8_8_ = local_7c;
          local_68._24_8_ = "new_tuple.v% = tuple.v%;";
          local_7c = (undefined1  [4])uVar7;
          IndentPrinter::println<Format<PrintNumber,PrintNumber>>
                    (this_00,(Format<PrintNumber,_PrintNumber> *)local_68);
        }
      }
      uVar8 = uVar8 + 1;
      pp_Var5 = type[1]._vptr_Type;
    } while (uVar8 < (ulong)((long)type[2]._vptr_Type - (long)pp_Var5 >> 3));
  }
  IndentPrinter::println<char[18]>(this_00,(char (*) [18])"return new_tuple;");
  this_00->indentation = this_00->indentation - 1;
  IndentPrinter::println<char[2]>(this_00,(char (*) [2])0x13a897);
  local_48 = "static % %_free(%);";
  local_68._0_8_ = &local_38;
  local_68._8_8_ = &local_40;
  local_68._16_8_ = &local_40;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this->function_declaration_printer,
             (Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  local_48 = "static % %_free(% tuple) {";
  local_68._0_8_ = &local_38;
  local_68._8_8_ = &local_40;
  local_68._16_8_ = &local_40;
  IndentPrinter::println<Format<CodegenC::Type,CodegenC::Type,CodegenC::Type>>
            (this_00,(Format<CodegenC::Type,_CodegenC::Type,_CodegenC::Type> *)local_68);
  uVar6 = this_00->indentation;
  this_00->indentation = uVar6 + 1;
  pp_Var5 = type[1]._vptr_Type;
  if (type[2]._vptr_Type != pp_Var5) {
    uVar8 = 0;
    do {
      iVar3 = (**(code **)(*(long *)pp_Var5[uVar8] + 0x10))();
      if ((iVar3 - 3U < 6) || (iVar3 == 10)) {
        pTVar1 = (Type *)type[1]._vptr_Type[uVar8];
        sVar4 = define_type(this,pTVar1);
        generate_functions(this,pTVar1);
        local_7c = SUB84(uVar8,0);
        local_68._0_8_ = &local_78;
        local_68._8_8_ = local_7c;
        local_68._24_8_ = "%_free(tuple.v%);";
        local_78.index = sVar4;
        IndentPrinter::println<Format<CodegenC::Type,PrintNumber>>
                  (this_00,(Format<CodegenC::Type,_PrintNumber> *)local_68);
      }
      uVar8 = uVar8 + 1;
      pp_Var5 = type[1]._vptr_Type;
    } while (uVar8 < (ulong)((long)type[2]._vptr_Type - (long)pp_Var5 >> 3));
    uVar6 = this_00->indentation - 1;
  }
  this_00->indentation = uVar6;
  IndentPrinter::println<char[2]>(this_00,(char (*) [2])0x13a897);
  return;
}

Assistant:

void generate_tuple_functions(const ::Type* type) {
			const Type tuple_type = get_type(type);
			const std::vector<const ::Type*>& element_types = static_cast<const TupleType*>(type)->get_element_types();
			const Type void_type = get_type(TypeInterner::get_void_type());
			IndentPrinter& printer = type_function_printer;

			// tuple_copy
			function_declaration_printer.println(format("static % %_copy(%);", tuple_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_copy(% tuple) {", tuple_type, tuple_type, tuple_type));
			printer.println(format("% new_tuple;", tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("new_tuple.v% = %_copy(tuple.v%);", print_number(i), get_type(element_types[i]), print_number(i)));
				}
				else if (element_types[i] != TypeInterner::get_void_type()) {
					printer.println(format("new_tuple.v% = tuple.v%;", print_number(i), print_number(i)));
				}
			}
			printer.println("return new_tuple;");
			printer.println_decreasing("}");

			// tuple_free
			function_declaration_printer.println(format("static % %_free(%);", void_type, tuple_type, tuple_type));
			printer.println_increasing(format("static % %_free(% tuple) {", void_type, tuple_type, tuple_type));
			for (std::size_t i = 0; i < element_types.size(); ++i) {
				if (is_managed(element_types[i])) {
					printer.println(format("%_free(tuple.v%);", get_type(element_types[i]), print_number(i)));
				}
			}
			printer.println_decreasing("}");
		}